

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O2

REF_STATUS ref_interp_process_agents(REF_INTERP ref_interp)

{
  REF_MPI ref_mpi;
  REF_AGENTS ref_agents;
  REF_CELL pRVar1;
  REF_AGENT_STRUCT *pRVar2;
  REF_ADJ pRVar3;
  REF_BOOL *pRVar4;
  REF_DBL *pRVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  REF_INT RVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  REF_NODE pRVar13;
  char *pcVar14;
  long lVar15;
  int local_70;
  REF_INT n_agents;
  REF_NODE local_68;
  uint local_5c;
  REF_INT *local_58;
  REF_INT *local_50;
  REF_INT *local_48;
  REF_CELL local_40;
  REF_NODE local_38;
  
  ref_mpi = ref_interp->ref_mpi;
  pRVar13 = ref_interp->from_grid->node;
  local_68 = ref_interp->to_grid->node;
  ref_agents = ref_interp->ref_agents;
  pRVar1 = (&ref_interp->from_tet)[ref_interp->from_grid->twod != 0];
  n_agents = ref_agents->n;
  uVar6 = ref_mpi_allsum(ref_mpi,&n_agents,1,1);
  if (uVar6 == 0) {
    local_50 = &ref_interp->walk_steps;
    local_48 = &ref_interp->n_terminated;
    local_58 = &ref_interp->n_walk;
    uVar7 = 0;
    local_40 = pRVar1;
    local_38 = pRVar13;
    while (0 < n_agents) {
      if ((ref_interp->instrument != 0) &&
         ((ref_interp->ref_mpi->id != 0 || (printf(" %2d sweep",uVar7), ref_interp->instrument != 0)
          ))) {
        ref_agents_population(ref_agents,"agent pop");
      }
      local_5c = (int)uVar7 + 1;
      lVar15 = 0;
      for (lVar12 = 0; lVar12 < ref_agents->max; lVar12 = lVar12 + 1) {
        if (((*(int *)((long)ref_agents->agent->xyz + lVar15 + -0x30) == 1) &&
            (*(int *)((long)ref_agents->agent->xyz + lVar15 + -0x1c) == ref_mpi->id)) &&
           (uVar6 = ref_interp_walk_agent(ref_interp,(REF_INT)lVar12), uVar6 != 0)) {
          pcVar14 = "walking";
          uVar10 = 0x367;
          goto LAB_0013efd7;
        }
        lVar15 = lVar15 + 0x68;
      }
      uVar6 = ref_agents_migrate(ref_agents);
      if (uVar6 != 0) {
        uVar7 = (ulong)uVar6;
        pcVar14 = "send it";
        uVar10 = 0x36b;
        goto LAB_0013f6ae;
      }
      lVar15 = 0;
      for (lVar12 = 0; uVar7 = (ulong)ref_agents->max, lVar12 < (long)uVar7; lVar12 = lVar12 + 1) {
        pRVar2 = ref_agents->agent;
        if ((*(int *)((long)pRVar2->xyz + lVar15 + -0x30) == 3) &&
           (*(int *)((long)pRVar2->xyz + lVar15 + -0x1c) == ref_mpi->id)) {
          uVar6 = ref_node_local(local_38,*(REF_GLOB *)((long)pRVar2->xyz + lVar15 + -0x10),
                                 &local_70);
          if (uVar6 != 0) {
            pcVar14 = "localize";
            uVar10 = 0x371;
            goto LAB_0013efd7;
          }
          pRVar2 = ref_agents->agent;
          *(undefined4 *)((long)pRVar2->xyz + lVar15 + -0x30) = 1;
          RVar9 = -1;
          if (((-1 < (long)local_70) && (pRVar3 = local_40->ref_adj, local_70 < pRVar3->nnode)) &&
             ((long)pRVar3->first[local_70] != -1)) {
            RVar9 = pRVar3->item[pRVar3->first[local_70]].ref;
          }
          *(REF_INT *)((long)pRVar2->xyz + lVar15 + -0x18) = RVar9;
        }
        lVar15 = lVar15 + 0x68;
      }
      lVar12 = 0x20;
      for (lVar15 = 0; lVar15 < (int)uVar7; lVar15 = lVar15 + 1) {
        pRVar2 = ref_agents->agent;
        if ((*(int *)((long)pRVar2->xyz + lVar12 + -0x50) == 4) &&
           (*(int *)((long)pRVar2->xyz + lVar12 + -0x44) == ref_mpi->id)) {
          uVar6 = ref_node_local(local_68,*(REF_GLOB *)((long)pRVar2->xyz + lVar12 + -0x30),
                                 &local_70);
          if (uVar6 != 0) {
            pcVar14 = "localize";
            uVar10 = 0x37c;
            goto LAB_0013efd7;
          }
          if ((ref_interp->cell[local_70] == -1) &&
             (pRVar4 = ref_interp->agent_hired, pRVar4[local_70] == 0)) {
            pRVar2 = ref_interp->ref_agents->agent;
            *(undefined4 *)((long)pRVar2->xyz + lVar12 + -0x50) = 1;
            *(int *)((long)pRVar2->xyz + lVar12 + -0x40) = local_70;
            *(undefined8 *)((long)pRVar2->xyz + lVar12 + -0x30) = 0xffffffffffffffff;
            pRVar4[local_70] = 1;
          }
          else {
            uVar6 = ref_agents_remove(ref_interp->ref_agents,(REF_INT)lVar15);
            if (uVar6 != 0) {
              pcVar14 = "already got one";
              uVar10 = 0x37f;
              goto LAB_0013efd7;
            }
          }
        }
        uVar7 = (ulong)(uint)ref_agents->max;
        lVar12 = lVar12 + 0x68;
      }
      lVar15 = 0;
      pRVar13 = local_68;
      for (lVar12 = 0; lVar12 < (int)uVar7; lVar12 = lVar12 + 1) {
        pRVar2 = ref_agents->agent;
        if (((*(uint *)((long)pRVar2->xyz + lVar15 + -0x30) | 4) == 6) &&
           (*(int *)((long)pRVar2->xyz + lVar15 + -0x24) == ref_mpi->id)) {
          local_70 = *(int *)((long)pRVar2->xyz + lVar15 + -0x20);
          lVar8 = (long)local_70;
          if ((lVar8 < 0) || ((pRVar13->max <= local_70 || (pRVar13->global[lVar8] < 0)))) {
            pcVar14 = "not valid";
            uVar10 = 0x38e;
            goto LAB_0013f733;
          }
          if (pRVar13->ref_mpi->id != pRVar13->part[lVar8]) {
            pcVar14 = "ghost, not owned";
            uVar10 = 0x38f;
            goto LAB_0013f733;
          }
          lVar11 = (long)ref_interp->cell[lVar8];
          if (lVar11 != -1) {
            uVar10 = 0x390;
            goto LAB_0013f709;
          }
          pRVar4 = ref_interp->agent_hired;
          if (pRVar4[lVar8] == 0) {
            pcVar14 = "should have an agent";
            uVar10 = 0x391;
            goto LAB_0013f733;
          }
          if (*(int *)((long)pRVar2->xyz + lVar15 + -0x30) == 6) {
            *(ulong *)local_48 =
                 CONCAT44(*(int *)((long)pRVar2->xyz + lVar15 + -8) + 1 +
                          (int)((ulong)*(undefined8 *)local_48 >> 0x20),
                          (int)*(undefined8 *)local_48 + 1);
          }
          pRVar4[lVar8] = 0;
          uVar6 = ref_agents_remove(ref_agents,(REF_INT)lVar12);
          if (uVar6 != 0) {
            pcVar14 = "no longer needed";
            uVar10 = 0x397;
            goto LAB_0013efd7;
          }
          uVar7 = (ulong)(uint)ref_agents->max;
          pRVar13 = local_68;
        }
        lVar15 = lVar15 + 0x68;
      }
      lVar12 = 0x48;
      for (lVar15 = 0; lVar15 < (int)uVar7; lVar15 = lVar15 + 1) {
        pRVar2 = ref_agents->agent;
        if ((pRVar2[lVar15].mode == REF_AGENT_ENCLOSING) && (pRVar2[lVar15].home == ref_mpi->id)) {
          local_70 = pRVar2[lVar15].node;
          lVar8 = (long)local_70;
          if ((lVar8 < 0) || ((pRVar13->max <= local_70 || (pRVar13->global[lVar8] < 0)))) {
            pcVar14 = "not valid";
            uVar10 = 0x39f;
LAB_0013f733:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,uVar10,"ref_interp_process_agents",pcVar14);
            return 1;
          }
          if (pRVar13->ref_mpi->id != pRVar13->part[lVar8]) {
            pcVar14 = "ghost, not owned";
            uVar10 = 0x3a0;
            goto LAB_0013f733;
          }
          lVar11 = (long)ref_interp->cell[lVar8];
          if (lVar11 != -1) {
            uVar10 = 0x3a1;
LAB_0013f709:
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,uVar10,"ref_interp_process_agents","already found?",0xffffffffffffffff,lVar11);
            return 1;
          }
          pRVar4 = ref_interp->agent_hired;
          if (pRVar4[lVar8] == 0) {
            pcVar14 = "should have an agent";
            uVar10 = 0x3a2;
            goto LAB_0013f733;
          }
          ref_interp->cell[lVar8] = pRVar2[lVar15].seed;
          ref_interp->part[local_70] = pRVar2[lVar15].part;
          pRVar5 = ref_interp->bary;
          for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
            pRVar5[local_70 * 4 + lVar8] =
                 *(REF_DBL *)((long)pRVar2->xyz + lVar8 * 8 + lVar12 + -0x30);
          }
          *local_50 = pRVar2[lVar15].step + *local_50 + 1;
          *local_58 = *local_58 + 1;
          pRVar4[local_70] = 0;
          uVar6 = ref_agents_remove(ref_agents,(REF_INT)lVar15);
          if (uVar6 != 0) {
            pcVar14 = "no longer needed";
            uVar10 = 0x3ac;
            goto LAB_0013efd7;
          }
          uVar6 = ref_interp_push_onto_queue(ref_interp,local_70);
          if (uVar6 != 0) {
            pcVar14 = "push";
            uVar10 = 0x3ad;
            goto LAB_0013efd7;
          }
          uVar7 = (ulong)(uint)ref_agents->max;
          pRVar13 = local_68;
        }
        lVar12 = lVar12 + 0x68;
      }
      n_agents = ref_agents->n;
      uVar6 = ref_mpi_allsum(ref_mpi,&n_agents,1,1);
      uVar7 = (ulong)local_5c;
      if (uVar6 != 0) {
        uVar7 = (ulong)uVar6;
        pcVar14 = "sum";
        uVar10 = 0x3b2;
LAB_0013f6ae:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               uVar10,"ref_interp_process_agents",uVar7,pcVar14);
        return (REF_STATUS)uVar7;
      }
    }
    uVar6 = ref_mpi_allsum(ref_mpi,local_50,1,1);
    if (uVar6 != 0) {
      uVar7 = (ulong)uVar6;
      pcVar14 = "sum";
      uVar10 = 0x3b6;
      goto LAB_0013f6ae;
    }
    uVar6 = ref_mpi_allsum(ref_mpi,local_58,1,1);
    if (uVar6 != 0) {
      uVar7 = (ulong)uVar6;
      pcVar14 = "sum";
      uVar10 = 0x3b7;
      goto LAB_0013f6ae;
    }
    uVar6 = ref_mpi_allsum(ref_mpi,local_48,1,1);
    if (uVar6 == 0) {
      lVar12 = 0;
      while( true ) {
        local_70 = (int)lVar12;
        if (local_68->max <= lVar12) {
          return 0;
        }
        if (((-1 < local_68->global[lVar12]) && (local_68->ref_mpi->id == local_68->part[lVar12]))
           && ((long)ref_interp->agent_hired[lVar12] != 0)) break;
        lVar12 = lVar12 + 1;
      }
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x3bd,"ref_interp_process_agents","should be done",0,
             (long)ref_interp->agent_hired[lVar12]);
      return 1;
    }
    pcVar14 = "sum";
    uVar10 = 0x3b9;
  }
  else {
    pcVar14 = "sum";
    uVar10 = 0x35c;
  }
LAB_0013efd7:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar10,
         "ref_interp_process_agents",(ulong)uVar6,pcVar14);
  return uVar6;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_process_agents(REF_INTERP ref_interp) {
  REF_NODE from_node = ref_grid_node(ref_interp_from_grid(ref_interp));
  REF_NODE to_node = ref_grid_node(ref_interp_to_grid(ref_interp));
  REF_CELL from_cell;
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_AGENTS ref_agents = ref_interp->ref_agents;
  REF_INT i, id, node;
  REF_INT n_agents;
  REF_INT sweep = 0;

  if (ref_grid_twod(ref_interp_from_grid(ref_interp))) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }

  n_agents = ref_agents_n(ref_agents);
  RSS(ref_mpi_allsum(ref_mpi, &n_agents, 1, REF_INT_TYPE), "sum");

  while (n_agents > 0) {
    if (ref_interp->instrument && ref_mpi_once(ref_interp->ref_mpi))
      printf(" %2d sweep", sweep);
    if (ref_interp->instrument) ref_agents_population(ref_agents, "agent pop");
    sweep++;

    each_active_ref_agent(ref_agents, id) {
      if (REF_AGENT_WALKING == ref_agent_mode(ref_agents, id) &&
          ref_agent_part(ref_agents, id) == ref_mpi_rank(ref_mpi)) {
        RSS(ref_interp_walk_agent(ref_interp, id), "walking");
      }
    }

    RSS(ref_agents_migrate(ref_agents), "send it");

    each_active_ref_agent(ref_agents, id) {
      if (REF_AGENT_HOP_PART == ref_agent_mode(ref_agents, id) &&
          ref_agent_part(ref_agents, id) == ref_mpi_rank(ref_mpi)) {
        RSS(ref_node_local(from_node, ref_agent_global(ref_agents, id), &node),
            "localize");
        ref_agent_mode(ref_agents, id) = REF_AGENT_WALKING;
        /* pick best from orbit? */
        ref_agent_seed(ref_agents, id) = ref_cell_first_with(from_cell, node);
      }
    }

    each_active_ref_agent(ref_agents, id) {
      if (REF_AGENT_SUGGESTION == ref_agent_mode(ref_agents, id) &&
          ref_agent_home(ref_agents, id) == ref_mpi_rank(ref_mpi)) {
        RSS(ref_node_local(to_node, ref_agent_global(ref_agents, id), &node),
            "localize");
        if (REF_EMPTY != ref_interp->cell[node] ||
            ref_interp->agent_hired[node]) {
          RSS(ref_agents_remove(ref_interp->ref_agents, id), "already got one");
        } else {
          ref_agent_mode(ref_interp->ref_agents, id) = REF_AGENT_WALKING;
          ref_agent_node(ref_interp->ref_agents, id) = node;
          ref_agent_global(ref_interp->ref_agents, id) = REF_EMPTY;
          ref_interp->agent_hired[node] = REF_TRUE;
        }
      }
    }

    each_active_ref_agent(ref_agents, id) {
      if ((REF_AGENT_AT_BOUNDARY == ref_agent_mode(ref_agents, id) ||
           REF_AGENT_TERMINATED == ref_agent_mode(ref_agents, id)) &&
          ref_agent_home(ref_agents, id) == ref_mpi_rank(ref_mpi)) {
        node = ref_agent_node(ref_agents, id);
        RAS(ref_node_valid(to_node, node), "not valid");
        RAS(ref_node_owned(to_node, node), "ghost, not owned");
        REIS(REF_EMPTY, ref_interp->cell[node], "already found?");
        RAS(ref_interp->agent_hired[node], "should have an agent");
        if (REF_AGENT_TERMINATED == ref_agent_mode(ref_agents, id)) {
          (ref_interp->walk_steps) += (ref_agent_step(ref_agents, id) + 1);
          (ref_interp->n_terminated)++;
        }
        ref_interp->agent_hired[node] = REF_FALSE; /* but no more */
        RSS(ref_agents_remove(ref_agents, id), "no longer needed");
      }
    }

    each_active_ref_agent(ref_agents, id) {
      if (REF_AGENT_ENCLOSING == ref_agent_mode(ref_agents, id) &&
          ref_agent_home(ref_agents, id) == ref_mpi_rank(ref_mpi)) {
        node = ref_agent_node(ref_agents, id);
        RAS(ref_node_valid(to_node, node), "not valid");
        RAS(ref_node_owned(to_node, node), "ghost, not owned");
        REIS(REF_EMPTY, ref_interp->cell[node], "already found?");
        RAS(ref_interp->agent_hired[node], "should have an agent");

        ref_interp->cell[node] = ref_agent_seed(ref_agents, id);
        ref_interp->part[node] = ref_agent_part(ref_agents, id);
        for (i = 0; i < 4; i++)
          ref_interp->bary[i + 4 * node] = ref_agent_bary(ref_agents, i, id);
        (ref_interp->walk_steps) += (ref_agent_step(ref_agents, id) + 1);
        (ref_interp->n_walk)++;

        ref_interp->agent_hired[node] = REF_FALSE; /* but no more */
        RSS(ref_agents_remove(ref_agents, id), "no longer needed");
        RSS(ref_interp_push_onto_queue(ref_interp, node), "push");
      }
    }

    n_agents = ref_agents_n(ref_agents);
    RSS(ref_mpi_allsum(ref_mpi, &n_agents, 1, REF_INT_TYPE), "sum");
  }

  RSS(ref_mpi_allsum(ref_mpi, &(ref_interp->walk_steps), 1, REF_INT_TYPE),
      "sum");
  RSS(ref_mpi_allsum(ref_mpi, &(ref_interp->n_walk), 1, REF_INT_TYPE), "sum");
  RSS(ref_mpi_allsum(ref_mpi, &(ref_interp->n_terminated), 1, REF_INT_TYPE),
      "sum");

  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node))
      REIS(REF_FALSE, ref_interp->agent_hired[node], "should be done");
  }

  return REF_SUCCESS;
}